

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall google::protobuf::RepeatedField<int>::~RepeatedField(RepeatedField<int> *this)

{
  int *piVar1;
  
  if (0 < this->total_size_) {
    piVar1 = elements(this);
    if (*(long *)(piVar1 + -2) == 0) {
      operator_delete(piVar1 + -2,(long)this->total_size_ * 4 + 8);
      return;
    }
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  if (total_size_ > 0) {
    InternalDeallocate(rep(), total_size_);
  }
}